

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O0

void __thiscall helics::zeromq::ZmqComms::loadNetworkInfo(ZmqComms *this,NetworkBrokerData *netInfo)

{
  bool bVar1;
  CommsInterface *in_RSI;
  CommsInterface *in_RDI;
  NetworkBrokerData *in_stack_00000058;
  NetworkCommsInterface *in_stack_00000060;
  CommsInterface *this_00;
  
  this_00 = in_RDI;
  NetworkCommsInterface::loadNetworkInfo(in_stack_00000060,in_stack_00000058);
  bVar1 = CommsInterface::propertyLock(this_00);
  if (bVar1) {
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4ba2d3);
    if (!bVar1) {
      gmlc::networking::insertProtocol((string *)in_RSI,(InterfaceTypes)((ulong)in_RDI >> 0x38));
    }
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4ba2f9);
    if (!bVar1) {
      gmlc::networking::insertProtocol((string *)in_RSI,(InterfaceTypes)((ulong)in_RDI >> 0x38));
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RSI,(char *)in_RDI);
    if (bVar1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
                (char *)in_RDI);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_RSI,(char *)in_RDI);
      if (bVar1) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
                  (char *)in_RDI);
      }
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RSI,(char *)in_RDI);
    if (bVar1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
                (char *)in_RDI);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_RSI,(char *)in_RDI);
      if (bVar1) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
                  (char *)in_RDI);
      }
    }
    CommsInterface::propertyUnLock(in_RSI);
  }
  return;
}

Assistant:

void ZmqComms::loadNetworkInfo(const NetworkBrokerData& netInfo)
{
    NetworkCommsInterface::loadNetworkInfo(netInfo);
    if (!propertyLock()) {
        return;
    }
    if (!brokerTargetAddress.empty()) {
        gmlc::networking::insertProtocol(brokerTargetAddress,
                                         gmlc::networking::InterfaceTypes::TCP);
    }
    if (!localTargetAddress.empty()) {
        gmlc::networking::insertProtocol(localTargetAddress, gmlc::networking::InterfaceTypes::TCP);
    }
    if (localTargetAddress == "tcp://localhost") {
        localTargetAddress = "tcp://127.0.0.1";
    } else if (localTargetAddress == "udp://localhost") {
        localTargetAddress = "udp://127.0.0.1";
    }
    if (brokerTargetAddress == "tcp://localhost") {
        brokerTargetAddress = "tcp://127.0.0.1";
    } else if (brokerTargetAddress == "udp://localhost") {
        brokerTargetAddress = "udp://127.0.0.1";
    }
    propertyUnLock();
}